

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAssemblerLabel.cpp
# Opt level: O0

void __thiscall CAssemblerLabel::writeTempData(CAssemblerLabel *this,TempData *tempData)

{
  TempData *this_00;
  bool bVar1;
  element_type *peVar2;
  Identifier *pIVar3;
  int64_t memoryAddress;
  string local_38;
  TempData *local_18;
  TempData *tempData_local;
  CAssemblerLabel *this_local;
  
  local_18 = tempData;
  tempData_local = (TempData *)this;
  peVar2 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                     ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->label);
  pIVar3 = Label::getName(peVar2);
  bVar1 = SymbolTable::isGeneratedLabel(&Global.symbolTable,pIVar3);
  this_00 = local_18;
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->label);
    memoryAddress = Label::getValue(peVar2);
    peVar2 = std::__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                       ((__shared_ptr_access<Label,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        &this->label);
    pIVar3 = Label::getName(peVar2);
    tinyformat::format<Identifier>(&local_38,"%s:",pIVar3);
    TempData::writeLine(this_00,memoryAddress,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return;
}

Assistant:

void CAssemblerLabel::writeTempData(TempData& tempData) const
{
	if (!Global.symbolTable.isGeneratedLabel(label->getName()))
		tempData.writeLine(label->getValue(),tfm::format("%s:",label->getName()));
}